

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::LinearDerivateUniformSetup::setup
          (LinearDerivateUniformSetup *this,ShaderRenderCaseInstance *instance,Vec4 *constCoords)

{
  int iVar1;
  Vec4 *constCoords_local;
  ShaderRenderCaseInstance *instance_local;
  LinearDerivateUniformSetup *this_local;
  
  DerivateUniformSetup::setup(&this->super_DerivateUniformSetup,instance,constCoords);
  if ((*(int *)&(this->super_DerivateUniformSetup).field_0x14 != 0x48) &&
     ((iVar1 = *(int *)&(this->super_DerivateUniformSetup).field_0x14, iVar1 == 1 ||
      (iVar1 == 5 || iVar1 == 6)))) {
    ShaderRenderCaseInstance::useUniform
              (instance,2,*(BaseUniformType *)&(this->super_DerivateUniformSetup).field_0x14);
  }
  return;
}

Assistant:

void LinearDerivateUniformSetup::setup (ShaderRenderCaseInstance& instance, const tcu::Vec4& constCoords) const
{
	DerivateUniformSetup::setup(instance, constCoords);

	if (m_usedDefaultUniform != U_LAST)
		switch (m_usedDefaultUniform)
		{
			case UB_TRUE:
			case UI_ONE:
			case UI_TWO:
				instance.useUniform(2u, m_usedDefaultUniform);
				break;
			default:
				DE_ASSERT(false);
				break;
		}
}